

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otsu_method.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  allocator local_e9;
  string local_e8 [8];
  string path;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  BMPImg grayscale_img;
  char **argv_local;
  int argc_local;
  
  grayscale_img._112_8_ = argv;
  if (argc == 2) {
    simpleBMP::BMPImg::BMPImg((BMPImg *)local_90);
    pcVar1 = *(char **)(grayscale_img._112_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    simpleBMP::BMPImg::LoadImage<void>((BMPImg *)local_90,(string *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    if (grayscale_img.info_header.biWidth._2_2_ != 8) {
      __assert_fail("grayscale_img.info_header.biBitCount == 8 && \"Only support 8-bit gray-scale image\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/edimetia3d[P]simpleBMP/sample/otsu_method.cpp"
                    ,0x42,"int main(int, char **)");
    }
    Otsu((BMPImg *)local_90);
    pcVar1 = *(char **)(grayscale_img._112_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::__cxx11::string::operator+=(local_e8,".otsu.bmp");
    simpleBMP::BMPImg::SaveImage<void>((BMPImg *)local_90,(string *)local_e8);
    argv_local._4_4_ = 0;
    std::__cxx11::string::~string(local_e8);
    simpleBMP::BMPImg::~BMPImg((BMPImg *)local_90);
  }
  else {
    fprintf(_stderr,"Usage: %s <path_to_input_image>\n",*argv);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2) {
    fprintf(stderr, "Usage: %s <path_to_input_image>\n", argv[0]);
    return 1;
  }
  simpleBMP::BMPImg grayscale_img;
  grayscale_img.LoadImage(argv[1]);
  assert(grayscale_img.info_header.biBitCount == 8 &&
         "Only support 8-bit gray-scale image");
  Otsu(&grayscale_img);

  std::string path = argv[1];
  path += ".otsu.bmp";
  grayscale_img.SaveImage(path);
  return 0;
}